

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintAsp(TidyDocImpl *doc,uint indent,Node *node)

{
  uint mode;
  uint saveWrap;
  bool bVar1;
  
  bVar1 = *(int *)((doc->config).value + 0x5a) == 0;
  mode = 0x10;
  if (bVar1) {
    mode = 2;
  }
  saveWrap = WrapOffCond(doc,(uint)(bVar1 || (int)(doc->config).value[0x5c].v == 0));
  AddString(&doc->pprint,"<%");
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"%>");
  WrapOn(doc,saveWrap);
  return;
}

Assistant:

static void PPrintAsp( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapAsp  = cfgBool( doc, TidyWrapAsp );
    Bool wrapJste = cfgBool( doc, TidyWrapJste );
    uint saveWrap = WrapOffCond( doc, !wrapAsp || !wrapJste );

    AddString( pprint, "<%" );
    PPrintText( doc, (wrapAsp ? CDATA : COMMENT), indent, node );
    AddString( pprint, "%>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}